

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::resume(QXmlStreamReaderPrivate *this,int rule)

{
  int in_ESI;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  Error error;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->resumeReduction = in_ESI;
  if (in_RDI->error == NoError) {
    error = (Error)((ulong)local_20 >> 0x20);
    QString::QString((QString *)0x64203b);
    raiseError(in_RDI,error,in_stack_ffffffffffffffa8);
    QString::~QString((QString *)0x64205b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resume(int rule) {
    resumeReduction = rule;
    if (error == QXmlStreamReader::NoError)
        raiseError(QXmlStreamReader::PrematureEndOfDocumentError);
}